

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O3

void * my_canvas_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_iem_fstyle_flags tVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  t_iemgui *iemgui;
  _glist *p_Var7;
  ulong uVar8;
  t_symbol *ptVar9;
  uint uVar10;
  t_float tVar11;
  t_float tVar12;
  undefined1 auVar13 [16];
  char str [80];
  uint local_a8;
  uint uStack_a4;
  undefined8 local_98;
  t_iemgui_drawfunctions local_88;
  
  iemgui = iemgui_new(my_canvas_class);
  p_Var7 = canvas_getcurrent();
  iVar3 = sys_zoomfontheight(p_Var7->gl_font,1,0);
  iVar3 = iVar3 + 5;
  p_Var7 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var7->gl_font,1,0);
  p_Var7 = canvas_getcurrent();
  iVar5 = sys_zoomfontheight(p_Var7->gl_font,1,0);
  auVar13._0_8_ = (double)(iVar4 * 100 + 500);
  auVar13._8_8_ = (double)(iVar5 * 0x3c + 300);
  auVar13 = divpd(auVar13,_DAT_001b7df0);
  local_a8 = (uint)auVar13._0_8_;
  uStack_a4 = (uint)auVar13._8_8_;
  iVar4 = iemgui->x_fontsize;
  local_88.draw_new = my_canvas_draw_new;
  local_88.draw_config = my_canvas_draw_config;
  local_88.draw_iolets = my_canvas_draw_io;
  local_88.draw_update = (t_iemdrawfunptr)0x0;
  local_88.draw_select = my_canvas_draw_select;
  local_88.draw_erase = (t_iemdrawfunptr)0x0;
  local_88.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_88);
  iemgui->x_fcol = 0;
  iemgui->x_bcol = 0xe0e0e0;
  iemgui->x_lcol = 0x404040;
  if ((((argc - 10U < 4) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
     (argv[2].a_type == A_FLOAT)) {
    tVar11 = atom_getfloatarg(0,argc,argv);
    iVar3 = (int)tVar11;
    tVar11 = atom_getfloatarg(1,argc,argv);
    tVar12 = atom_getfloatarg(2,argc,argv);
    local_a8 = (uint)tVar11;
    uStack_a4 = (uint)tVar12;
  }
  if (argc < 0xc) {
    if ((argc != 0xb) || (1 < argv[3].a_type - A_FLOAT)) goto LAB_0014b531;
    iemgui_new_getnames(iemgui,3,argv);
    iVar5 = 1;
LAB_0014b549:
    uVar8 = (ulong)(uint)(iVar5 << 4);
    iVar1 = *(int *)((long)&argv[3].a_type + uVar8);
    local_98 = 0xc00000014;
    if ((((iVar1 - 1U < 2) && (*(int *)((long)&argv[4].a_type + uVar8) == 1)) &&
        (*(int *)((long)&argv[5].a_type + uVar8) == 1)) &&
       ((*(int *)((long)&argv[6].a_type + uVar8) == 1 &&
        (*(int *)((long)&argv[7].a_type + uVar8) == 1)))) {
      if (iVar1 == 1) {
        atom_string((t_atom *)((long)&argv[3].a_type + uVar8),(char *)&local_88,0x50);
        ptVar9 = gensym((char *)&local_88);
      }
      else {
        ptVar9 = iemgui_new_dogetname(iemgui,iVar5 + 3,argv);
      }
      iemgui->x_lab = ptVar9;
      iemgui->x_labelbindex = iVar5 + 4;
      tVar11 = atom_getfloatarg(iVar5 + 4,argc,argv);
      tVar12 = atom_getfloatarg(iVar5 + 5,argc,argv);
      local_98 = CONCAT44((int)tVar12,(int)tVar11);
      tVar11 = atom_getfloatarg(iVar5 + 6,argc,argv);
      iem_inttofstyle(&iemgui->x_fsf,(int)tVar11);
      tVar11 = atom_getfloatarg(iVar5 + 7,argc,argv);
      iVar4 = (int)tVar11;
      iemgui->x_fontsize = iVar4;
      iemgui_all_loadcolors
                (iemgui,(t_atom *)((long)&argv[8].a_type + uVar8),(t_atom *)0x0,
                 (t_atom *)((long)&argv[9].a_type + uVar8));
    }
    if ((argc == 0xd) && (*(int *)((long)&argv[10].a_type + uVar8) == 1)) {
      tVar11 = atom_getfloatarg(iVar5 + 10,0xd,argv);
      iem_inttosymargs(&iemgui->x_isa,(int)tVar11);
    }
  }
  else {
    if ((argv[3].a_type - A_FLOAT < 2) && (argv[4].a_type - A_FLOAT < 2)) {
      iemgui_new_getnames(iemgui,3,argv);
      iVar5 = 2;
    }
    else {
LAB_0014b531:
      iVar5 = 0;
      iemgui_new_getnames(iemgui,3,(t_atom *)0x0);
    }
    if (argc - 10U < 4) goto LAB_0014b549;
    local_98 = 0xc00000014;
  }
  tVar2 = iemgui->x_fsf;
  uVar6 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  ptVar9 = iemgui->x_rcv;
  uVar10 = (uint)(ptVar9 != (t_symbol *)0x0) << 6;
  iVar5 = 1;
  if (1 < iVar3) {
    iVar5 = iVar3;
  }
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar10 | (uint)tVar2 & 0xffffff3f | uVar6);
  iemgui->x_w = iVar5;
  iemgui->x_h = iVar5;
  *(uint *)&iemgui[1].x_glist =
       ~-(uint)(1 < (int)local_a8) & 1 | local_a8 & -(uint)(1 < (int)local_a8);
  *(uint *)((long)&iemgui[1].x_glist + 4) =
       ~-(uint)(1 < (int)uStack_a4) & 1 | uStack_a4 & -(uint)(1 < (int)uStack_a4);
  if (((uint)tVar2 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
LAB_0014b765:
    if (ptVar9 == (t_symbol *)0x0) goto LAB_0014b779;
  }
  else {
    if (((uint)tVar2 & 0x3f) == 2) {
      builtin_strncpy(iemgui->x_font,"times",6);
      goto LAB_0014b765;
    }
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar10 | (uint)tVar2 & 0xffffff00 | uVar6);
    strcpy(iemgui->x_font,sys_font);
    if (((uint)iemgui->x_fsf & 0x40) == 0) goto LAB_0014b779;
  }
  pd_bind((t_pd *)iemgui,iemgui->x_rcv);
LAB_0014b779:
  iemgui->x_ldx = (undefined4)local_98;
  iemgui->x_ldy = local_98._4_4_;
  iVar3 = 4;
  if (4 < iVar4) {
    iVar3 = iVar4;
  }
  iemgui->x_fontsize = iVar3;
  *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 1;
  *(undefined4 *)&iemgui[1].x_obj.te_binbuf = 1;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  return iemgui;
}

Assistant:

static void *my_canvas_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_canvas *x = (t_my_canvas *)iemgui_new(my_canvas_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int w = 100 * IEM_GUI_DEFAULTSIZE_SCALE, h = 60 * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = 20, ldy = 12, f = 2, i = 0;
    int fs = x->x_gui.x_fontsize;

    IEMGUI_SETDRAWFUNCTIONS(x, my_canvas);

    x->x_gui.x_bcol = 0xE0E0E0;
    x->x_gui.x_fcol = 0x00;
    x->x_gui.x_lcol = 0x404040;

    if(((argc >= 10)&&(argc <= 13))
       &&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2))
    {
        a = atom_getfloatarg(0, argc, argv);
        w = atom_getfloatarg(1, argc, argv);
        h = atom_getfloatarg(2, argc, argv);
    }
    if((argc >= 12)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))&&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4)))
    {
        i = 2;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else if((argc == 11)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3)))
    {
        i = 1;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 3, 0);

    if(((argc >= 10)&&(argc <= 13))
       &&(IS_A_SYMBOL(argv,i+3)||IS_A_FLOAT(argv,i+3))&&IS_A_FLOAT(argv,i+4)
       &&IS_A_FLOAT(argv,i+5)&&IS_A_FLOAT(argv,i+6)
       &&IS_A_FLOAT(argv,i+7))
    {
            /* disastrously, the "label" sits in a different part of the
            message.  So we have to track its location separately (in
            the slot x_labelbindex) and initialize it specially here. */
        if(IS_A_FLOAT(argv, i+3))
        {
            char str[80];
            atom_string(argv+i+3, str, sizeof(str));
            x->x_gui.x_lab = gensym(str);
        } else {
            x->x_gui.x_lab = iemgui_new_dogetname(&x->x_gui, i+3, argv);
        }
        x->x_gui.x_labelbindex = i+4;
        ldx = atom_getfloatarg(i+4, argc, argv);
        ldy = atom_getfloatarg(i+5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(i+6, argc, argv));
        fs = atom_getfloatarg(i+7, argc, argv);
        x->x_gui.x_fontsize = fs;
        iemgui_all_loadcolors(&x->x_gui, argv+i+8, 0, argv+i+9);
    }
    if((argc == 13)&&IS_A_FLOAT(argv,i+10))
    {
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(i+10, argc, argv));
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a;
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_at[0].a_type = A_FLOAT;
    x->x_at[1].a_type = A_FLOAT;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    return (x);
}